

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::expression_read_implies_multiple_reads(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  bool bVar2;
  ulong uVar3;
  SPIRExpression *pSVar4;
  
  uVar3 = (ulong)id;
  if ((uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar3].type == TypeExpression)) {
    pSVar4 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar3);
  }
  else {
    pSVar4 = (SPIRExpression *)0x0;
  }
  if (pSVar4 == (SPIRExpression *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = pSVar4->emitted_loop_level < (this->super_Compiler).current_loop_level;
  }
  return bVar2;
}

Assistant:

bool CompilerGLSL::expression_read_implies_multiple_reads(uint32_t id) const
{
	auto *expr = maybe_get<SPIRExpression>(id);
	if (!expr)
		return false;

	// If we're emitting code at a deeper loop level than when we emitted the expression,
	// we're probably reading the same expression over and over.
	return current_loop_level > expr->emitted_loop_level;
}